

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_things.cpp
# Opt level: O2

void R_DrawVisSprite(vissprite_t *vis)

{
  int iVar1;
  FTexture *pFVar2;
  bool bVar3;
  bool bVar4;
  ushort uVar5;
  ESPSResult EVar6;
  int iVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  fixed_t fVar9;
  double dVar10;
  Span *spans;
  int local_44;
  vissprite_t *local_40;
  int local_34;
  
  if (vis->sector == (sector_t *)0x0) {
    bVar3 = true;
    if (((vis->gpos).X == 0.0) && ((vis->gpos).Y == 0.0)) {
      bVar3 = (vis->gpos).Z != 0.0;
    }
  }
  else {
    bVar3 = false;
  }
  if ((vis->xscale != 0) && (vis->yscale != 0.0)) {
    dc_colormap = (vis->Style).colormap;
    EVar6 = R_SetPatchStyle((vis->Style).RenderStyle,(vis->Style).Alpha,vis->Translation,
                            vis->FillColor);
    if ((vis->Style).RenderStyle.AsDWORD == LegacyRenderStyles[8].AsDWORD) {
      dc_colormap = dc_colormap + (ulong)vis->ColormapNum * 0x100;
    }
    local_40 = vis;
    if (EVar6 != DontDraw) {
      if (EVar6 == DoDraw0) {
        uVar5 = vis->x1;
      }
      else {
        uVar5 = vis->x2 & 0xfffc;
      }
      pFVar2 = (vis->field_13).pic;
      dVar10 = (double)vis->yscale;
      dc_iscale = SUB84((double)(1.0 / vis->yscale) + 103079215104.0,0);
      fVar9 = (vis->field_14).field_0.startfrac;
      iVar1 = (vis->field_14).field_0.xiscale;
      dc_texturemid = (vis->field_14).field_0.texturemid;
      sprflipvert = (vis->renderflags & 2) != 0;
      spryscale = dVar10;
      if (sprflipvert) {
        dc_iscale = -dc_iscale;
        dc_texturemid = dc_texturemid - (double)pFVar2->Height;
        spryscale = -dVar10;
      }
      sprtopscreen = CenterY - dc_texturemid * dVar10;
      dc_x = (int)vis->x1;
      local_34 = (int)vis->x2;
      if (vis->x1 < vis->x2) {
        local_44 = (int)(short)uVar5;
        for (; (dc_x < local_44 && ((dc_x & 3U) != 0)); dc_x = dc_x + 1) {
          iVar7 = (*pFVar2->_vptr_FTexture[2])(pFVar2,(ulong)(uint)(fVar9 >> 0x10),&spans);
          if ((bVar3) || (bVar4 = R_ClipSpriteColumnWithPortals(vis), !bVar4)) {
            R_DrawMaskedColumn((BYTE *)CONCAT44(extraout_var,iVar7),spans);
          }
          fVar9 = fVar9 + iVar1;
        }
        while (dc_x < local_44) {
          rt_initcols((BYTE *)0x0);
          for (iVar7 = -4; iVar7 != 0; iVar7 = iVar7 + 1) {
            iVar8 = (*pFVar2->_vptr_FTexture[2])(pFVar2,(ulong)(uint)(fVar9 >> 0x10),&spans);
            if ((bVar3) || (bVar4 = R_ClipSpriteColumnWithPortals(local_40), !bVar4)) {
              R_DrawMaskedColumnHoriz((BYTE *)CONCAT44(extraout_var_00,iVar8),spans);
            }
            dc_x = dc_x + 1;
            fVar9 = fVar9 + iVar1;
          }
          rt_draw4cols(dc_x + -4);
          vis = local_40;
        }
        for (; dc_x < local_34; dc_x = dc_x + 1) {
          iVar7 = (*pFVar2->_vptr_FTexture[2])(pFVar2,(ulong)(uint)(fVar9 >> 0x10),&spans);
          if ((bVar3) || (bVar4 = R_ClipSpriteColumnWithPortals(vis), !bVar4)) {
            R_DrawMaskedColumn((BYTE *)CONCAT44(extraout_var_01,iVar7),spans);
          }
          fVar9 = fVar9 + iVar1;
        }
      }
    }
    R_FinishSetPatchStyle();
    NetUpdate();
  }
  return;
}

Assistant:

void R_DrawVisSprite (vissprite_t *vis)
{
	const BYTE *pixels;
	const FTexture::Span *spans;
	fixed_t 		frac;
	FTexture		*tex;
	int				x2, stop4;
	fixed_t			xiscale;
	ESPSResult		mode;
	bool			ispsprite = (!vis->sector && vis->gpos != FVector3(0, 0, 0));

	if (vis->xscale == 0 || vis->yscale == 0)
	{ // scaled to 0; can't see
		return;
	}

	fixed_t centeryfrac = FLOAT2FIXED(CenterY);
	dc_colormap = vis->Style.colormap;

	mode = R_SetPatchStyle (vis->Style.RenderStyle, vis->Style.Alpha, vis->Translation, vis->FillColor);

	if (vis->Style.RenderStyle == LegacyRenderStyles[STYLE_Shaded])
	{ // For shaded sprites, R_SetPatchStyle sets a dc_colormap to an alpha table, but
	  // it is the brightest one. We need to get back to the proper light level for
	  // this sprite.
		dc_colormap += vis->ColormapNum << COLORMAPSHIFT;
	}

	if (mode != DontDraw)
	{
		if (mode == DoDraw0)
		{
			// One column at a time
			stop4 = vis->x1;
		}
		else	 // DoDraw1
		{
			// Up to four columns at a time
			stop4 = vis->x2 & ~3;
		}

		tex = vis->pic;
		spryscale = vis->yscale;
		sprflipvert = false;
		dc_iscale = FLOAT2FIXED(1 / vis->yscale);
		frac = vis->startfrac;
		xiscale = vis->xiscale;
		dc_texturemid = vis->texturemid;

		if (vis->renderflags & RF_YFLIP)
		{
			sprflipvert = true;
			spryscale = -spryscale;
			dc_iscale = -dc_iscale;
			dc_texturemid -= vis->pic->GetHeight();
			sprtopscreen = CenterY + dc_texturemid * spryscale;
		}
		else
		{
			sprflipvert = false;
			sprtopscreen = CenterY - dc_texturemid * spryscale;
		}

		dc_x = vis->x1;
		x2 = vis->x2;

		if (dc_x < x2)
		{
			while ((dc_x < stop4) && (dc_x & 3))
			{
				pixels = tex->GetColumn (frac >> FRACBITS, &spans);
				if (ispsprite || !R_ClipSpriteColumnWithPortals(vis))
					R_DrawMaskedColumn (pixels, spans);
				dc_x++;
				frac += xiscale;
			}

			while (dc_x < stop4)
			{
				rt_initcols();
				for (int zz = 4; zz; --zz)
				{
					pixels = tex->GetColumn (frac >> FRACBITS, &spans);
					if (ispsprite || !R_ClipSpriteColumnWithPortals(vis))
						R_DrawMaskedColumnHoriz (pixels, spans);
					dc_x++;
					frac += xiscale;
				}
				rt_draw4cols (dc_x - 4);
			}

			while (dc_x < x2)
			{
				pixels = tex->GetColumn (frac >> FRACBITS, &spans);
				if (ispsprite || !R_ClipSpriteColumnWithPortals(vis))
					R_DrawMaskedColumn (pixels, spans);
				dc_x++;
				frac += xiscale;
			}
		}
	}

	R_FinishSetPatchStyle ();

	NetUpdate ();
}